

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockNodeMoveWindows(ImGuiDockNode *dst_node,ImGuiDockNode *src_node)

{
  ImGuiTabItem *pIVar1;
  ImGuiWindow **ppIVar2;
  ImGuiDockNode *in_RSI;
  long in_RDI;
  ImGuiWindow *window;
  int n;
  bool move_tab_bar;
  ImGuiTabBar *src_tab_bar;
  ImGuiWindow *local_38;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 uVar3;
  int local_20;
  byte add_to_tab_bar;
  ImGuiWindow *window_00;
  
  window_00 = (ImGuiWindow *)in_RSI->TabBar;
  uVar3 = false;
  if (window_00 != (ImGuiWindow *)0x0) {
    uVar3 = *(long *)(in_RDI + 0x38) == 0;
  }
  if ((bool)uVar3 != false) {
    *(ImGuiTabBar **)(in_RDI + 0x38) = in_RSI->TabBar;
    in_RSI->TabBar = (ImGuiTabBar *)0x0;
  }
  add_to_tab_bar = uVar3;
  for (local_20 = 0; local_20 < (in_RSI->Windows).Size; local_20 = local_20 + 1) {
    if (window_00 == (ImGuiWindow *)0x0) {
      ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&in_RSI->Windows,local_20);
      local_38 = *ppIVar2;
    }
    else {
      pIVar1 = ImVector<ImGuiTabItem>::operator[]((ImVector<ImGuiTabItem> *)window_00,local_20);
      local_38 = pIVar1->Window;
    }
    local_38->DockNode = (ImGuiDockNode *)0x0;
    local_38->field_0x43a = local_38->field_0x43a & 0xfe;
    DockNodeAddWindow(in_RSI,window_00,(bool)add_to_tab_bar);
  }
  ImVector<ImGuiWindow_*>::clear
            ((ImVector<ImGuiWindow_*> *)CONCAT17(uVar3,in_stack_ffffffffffffffd0));
  if (((add_to_tab_bar & 1) == 0) && (in_RSI->TabBar != (ImGuiTabBar *)0x0)) {
    if (*(long *)(in_RDI + 0x38) != 0) {
      *(ImGuiID *)(*(long *)(in_RDI + 0x38) + 0x14) = in_RSI->TabBar->SelectedTabId;
    }
    DockNodeRemoveTabBar((ImGuiDockNode *)0x1c9be1);
  }
  return;
}

Assistant:

static void ImGui::DockNodeMoveWindows(ImGuiDockNode* dst_node, ImGuiDockNode* src_node)
{
    // Insert tabs in the same orders as currently ordered (node->Windows isn't ordered)
    IM_ASSERT(src_node && dst_node && dst_node != src_node);
    ImGuiTabBar* src_tab_bar = src_node->TabBar;
    if (src_tab_bar != NULL)
        IM_ASSERT(src_node->Windows.Size == src_node->TabBar->Tabs.Size);

    // If the dst_node is empty we can just move the entire tab bar (to preserve selection, scrolling, etc.)
    bool move_tab_bar = (src_tab_bar != NULL) && (dst_node->TabBar == NULL);
    if (move_tab_bar)
    {
        dst_node->TabBar = src_node->TabBar;
        src_node->TabBar = NULL;
    }

    for (int n = 0; n < src_node->Windows.Size; n++)
    {
        ImGuiWindow* window = src_tab_bar ? src_tab_bar->Tabs[n].Window : src_node->Windows[n];
        window->DockNode = NULL;
        window->DockIsActive = false;
        DockNodeAddWindow(dst_node, window, move_tab_bar ? false : true);
    }
    src_node->Windows.clear();

    if (!move_tab_bar && src_node->TabBar)
    {
        if (dst_node->TabBar)
            dst_node->TabBar->SelectedTabId = src_node->TabBar->SelectedTabId;
        DockNodeRemoveTabBar(src_node);
    }
}